

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.cpp
# Opt level: O0

void __thiscall
arbiter::drivers::AZ::AZ
          (AZ *this,Pool *pool,string *profile,
          unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
          *config)

{
  bool bVar1;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  *local_28;
  unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  *config_local;
  string *profile_local;
  Pool *pool_local;
  AZ *this_local;
  
  local_28 = config;
  config_local = (unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
                  *)profile;
  profile_local = (string *)pool;
  pool_local = (Pool *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_48,"az",&local_49);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_80,"http",&local_81);
  bVar1 = ::std::operator==(profile,"default");
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_a8,(string *)profile);
  }
  Http::Http(&this->super_Http,pool,&local_48,&local_80,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (this->super_Http).super_Driver._vptr_Driver = (_func_int **)&PTR__AZ_0029b9b0;
  arbiter::std::
  unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>::
  unique_ptr(&this->m_config,config);
  return;
}

Assistant:

AZ::AZ(
        Pool& pool,
        std::string profile,
        std::unique_ptr<Config> config)
    : Http(pool, "az", "http", profile == "default" ? "" : profile)
    , m_config(std::move(config))
{ }